

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

void adjust_rdmult_tpl_model(AV1_COMP *cpi,MACROBLOCK *x,int mi_row,int mi_col)

{
  int iVar1;
  long in_RSI;
  long *in_RDI;
  int dr;
  int gf_group_index;
  int orig_rdmult;
  BLOCK_SIZE sb_size;
  int in_stack_00000098;
  int in_stack_0000009c;
  int in_stack_000000a0;
  BLOCK_SIZE in_stack_000000a7;
  AV1_COMP *in_stack_000000a8;
  
  if (((((*(byte *)((long)in_RDI + 0x42361) & 1) != 0) && ((char)in_RDI[0x8480] == '\0')) &&
      (*(char *)((long)in_RDI + 0x42401) == '\0')) &&
     ((*(byte *)(in_RDI + 0xe258) != 0 &&
      (*(char *)(*in_RDI + 400 + (long)(int)(uint)*(byte *)(in_RDI + 0xe258)) == '\x03')))) {
    iVar1 = av1_get_rdmult_delta
                      (in_stack_000000a8,in_stack_000000a7,in_stack_000000a0,in_stack_0000009c,
                       in_stack_00000098);
    *(int *)(in_RSI + 0x4218) = iVar1;
  }
  return;
}

Assistant:

static inline void adjust_rdmult_tpl_model(AV1_COMP *cpi, MACROBLOCK *x,
                                           int mi_row, int mi_col) {
  const BLOCK_SIZE sb_size = cpi->common.seq_params->sb_size;
  const int orig_rdmult = cpi->rd.RDMULT;

  assert(IMPLIES(cpi->ppi->gf_group.size > 0,
                 cpi->gf_frame_index < cpi->ppi->gf_group.size));
  const int gf_group_index = cpi->gf_frame_index;
  if (cpi->oxcf.algo_cfg.enable_tpl_model && cpi->oxcf.q_cfg.aq_mode == NO_AQ &&
      cpi->oxcf.q_cfg.deltaq_mode == NO_DELTA_Q && gf_group_index > 0 &&
      cpi->ppi->gf_group.update_type[gf_group_index] == ARF_UPDATE) {
    const int dr =
        av1_get_rdmult_delta(cpi, sb_size, mi_row, mi_col, orig_rdmult);
    x->rdmult = dr;
  }
}